

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QMdiSubWindow * __thiscall
QMdiArea::addSubWindow(QMdiArea *this,QWidget *widget,WindowFlags windowFlags)

{
  QMdiAreaPrivate *this_00;
  QWidget *this_01;
  qsizetype qVar1;
  QWidget *pQVar2;
  QWidget *parent;
  QMdiSubWindow *pQVar3;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    QMessageLogger::warning(local_58,"QMdiArea::addSubWindow: null pointer to widget");
    pQVar3 = (QMdiSubWindow *)0x0;
  }
  else {
    this_00 = *(QMdiAreaPrivate **)
               &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    this_01 = QWidget::focusWidget(widget);
    child = QtPrivate::qobject_cast_helper<QMdiSubWindow*,QObject>(&widget->super_QObject);
    if (child == (QMdiSubWindow *)0x0) {
      pQVar2 = (QWidget *)operator_new(0x28);
      parent = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QMdiSubWindow::QMdiSubWindow((QMdiSubWindow *)pQVar2,parent,windowFlags);
      child = (QMdiSubWindow *)pQVar2;
      QWidget::setAttribute(pQVar2,WA_DeleteOnClose,true);
      QMdiSubWindow::setWidget((QMdiSubWindow *)pQVar2,widget);
    }
    else {
      qVar1 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                        (&this_00->childWindows,&child,0);
      pQVar3 = child;
      if (qVar1 != -1) {
        local_58[0] = '\x02';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        local_58[0x10] = '\0';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_40 = "default";
        QMessageLogger::warning(local_58,"QMdiArea::addSubWindow: window is already added");
        pQVar3 = child;
        goto LAB_0040e579;
      }
      pQVar2 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      if ((QFlagsStorage<Qt::WindowType>)
          windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i == (QFlagsStorage<Qt::WindowType>)0x0) {
        windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>
        .i = (QFlagsStorageHelper<Qt::WindowType,_4>)
             (((child->super_QWidget).data)->window_flags).
             super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i;
      }
      QWidget::setParent(&pQVar3->super_QWidget,pQVar2,windowFlags);
      pQVar2 = &child->super_QWidget;
    }
    QMdiAreaPrivate::appendChild(this_00,(QMdiSubWindow *)pQVar2);
    pQVar3 = child;
    if (this_01 != (QWidget *)0x0) {
      QWidget::setFocus(this_01);
      pQVar3 = child;
    }
  }
LAB_0040e579:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QMdiSubWindow *QMdiArea::addSubWindow(QWidget *widget, Qt::WindowFlags windowFlags)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QMdiArea::addSubWindow: null pointer to widget");
        return nullptr;
    }

    Q_D(QMdiArea);
    // QWidget::setParent clears focusWidget so store it
    QWidget *childFocus = widget->focusWidget();
    QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(widget);

    // Widget is already a QMdiSubWindow
    if (child) {
        if (Q_UNLIKELY(d->childWindows.indexOf(child) != -1)) {
            qWarning("QMdiArea::addSubWindow: window is already added");
            return child;
        }
        child->setParent(viewport(), windowFlags ? windowFlags : child->windowFlags());
    // Create a QMdiSubWindow
    } else {
        child = new QMdiSubWindow(viewport(), windowFlags);
        child->setAttribute(Qt::WA_DeleteOnClose);
        child->setWidget(widget);
        Q_ASSERT(child->testAttribute(Qt::WA_DeleteOnClose));
    }

    d->appendChild(child);

    if (childFocus)
        childFocus->setFocus();

    return child;
}